

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

bool __thiscall
clipp::parser::try_match_joined_sequence<clipp::detail::select_all>
          (parser *this,arg_string *arg,select_all *acceptFirst)

{
  group *pgVar1;
  child_t<clipp::parameter,_clipp::group> *this_00;
  bool bVar2;
  iterator __begin2;
  pointer match;
  subrange sVar3;
  initializer_list<clipp::detail::match_t> __l;
  allocator_type local_309;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> matches;
  scoped_dfs_traverser pos;
  match_t fstMatch;
  match_t local_190;
  scoped_dfs_traverser local_d0;
  
  detail::scoped_dfs_traverser::scoped_dfs_traverser(&local_d0,&this->pos_);
  detail::prefix_match<clipp::detail::select_all>(&fstMatch,&local_d0,arg,acceptFirst);
  detail::scoped_dfs_traverser::~scoped_dfs_traverser(&local_d0);
  if (fstMatch.pos_.pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      fstMatch.pos_.pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (fstMatch.str_._M_string_length == arg->_M_string_length) {
      bVar2 = true;
      add_match(this,&fstMatch);
      goto LAB_00107edd;
    }
    bVar2 = group::child_t<clipp::parameter,_clipp::group>::blocking
                      (fstMatch.pos_.pos_.stack_.
                       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current);
    if (bVar2) {
      detail::scoped_dfs_traverser::scoped_dfs_traverser(&pos,&fstMatch.pos_);
      pos.ignoreBlocks_ = true;
      pgVar1 = pos.pos_.stack_.
               super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].parent;
      bVar2 = group::child_t<clipp::parameter,_clipp::group>::repeatable
                        (pos.pos_.stack_.
                         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current);
      if (!bVar2) {
        detail::scoped_dfs_traverser::operator++(&pos);
      }
      std::__cxx11::string::erase((ulong)arg,0);
      detail::match_t::match_t(&local_190,&fstMatch);
      __l._M_len = 1;
      __l._M_array = &local_190;
      std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::vector
                (&matches,__l,&local_309);
      detail::match_t::~match_t(&local_190);
LAB_00107dc4:
      if (arg->_M_string_length != 0) {
        if ((((pos.pos_.stack_.
               super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               pos.pos_.stack_.
               super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             (bVar2 = group::child_t<clipp::parameter,_clipp::group>::blocking
                                (pos.pos_.stack_.
                                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current),
             bVar2)) &&
            (this_00 = pos.pos_.stack_.
                       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current,
            this_00->type_ == param)) &&
           (pos.pos_.stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].parent == pgVar1)) {
          sVar3 = parameter::match((parameter *)this_00,arg);
          if (sVar3.at_ == 0) goto LAB_00107e34;
          bVar2 = group::child_t<clipp::parameter,_clipp::group>::repeatable
                            (pos.pos_.stack_.
                             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current);
          if (bVar2) goto LAB_00107e82;
          goto LAB_00107ec2;
        }
        if (arg->_M_string_length != 0) goto LAB_00107ec2;
      }
      match = matches.
              super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
      if (matches.
          super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          matches.
          super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_00107ec2:
        bVar2 = false;
      }
      else {
        for (; match != matches.
                        super__Vector_base<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish; match = match + 1) {
          add_match(this,match);
        }
        bVar2 = true;
      }
      std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::~vector
                (&matches);
      detail::scoped_dfs_traverser::~scoped_dfs_traverser(&pos);
      goto LAB_00107edd;
    }
  }
  bVar2 = false;
LAB_00107edd:
  detail::match_t::~match_t(&fstMatch);
  return bVar2;
LAB_00107e34:
  std::__cxx11::string::substr((ulong)&local_190,(ulong)arg);
  std::vector<clipp::detail::match_t,std::allocator<clipp::detail::match_t>>::
  emplace_back<std::__cxx11::string,clipp::detail::scoped_dfs_traverser&>
            ((vector<clipp::detail::match_t,std::allocator<clipp::detail::match_t>> *)&matches,
             &local_190.str_,&pos);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::erase((ulong)arg,0);
  bVar2 = group::child_t<clipp::parameter,_clipp::group>::repeatable
                    (pos.pos_.stack_.
                     super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current);
  if (!bVar2) {
LAB_00107e82:
    detail::scoped_dfs_traverser::operator++(&pos);
  }
  goto LAB_00107dc4;
}

Assistant:

bool try_match_joined_sequence(arg_string arg,
                                   const ParamSelector& acceptFirst)
    {
        auto fstMatch = detail::prefix_match(pos_, arg, acceptFirst);

        if(!fstMatch) return false;

        if(fstMatch.str().size() == arg.size()) {
            add_match(fstMatch);
            return true;
        }

        if(!fstMatch.pos()->blocking()) return false;

        auto pos = fstMatch.pos();
        pos.ignore_blocking(true);
        const auto parent = &pos.parent();
        if(!pos->repeatable()) ++pos;

        arg.erase(0, fstMatch.str().size());
        std::vector<match_t> matches { std::move(fstMatch) };

        while(!arg.empty() && pos &&
              pos->blocking() && pos->is_param() &&
              (&pos.parent() == parent))
        {
            auto match = pos->as_param().match(arg);

            if(match.prefix()) {
                matches.emplace_back(arg.substr(0,match.length()), pos);
                arg.erase(0, match.length());
                if(!pos->repeatable()) ++pos;
            }
            else {
                if(!pos->repeatable()) return false;
                ++pos;
            }

        }
        //if arg not fully covered => discard temporary matches
        if(!arg.empty() || matches.empty()) return false;

        for(const auto& m : matches) add_match(m);
        return true;
    }